

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:169:30)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:169:30)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  TutorialApplication *pTVar1;
  uint uVar2;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pTVar1 = (this->f).this;
  uVar2 = ParseStream::getInt(this_00);
  pTVar1->numFrames = uVar2;
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }